

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O2

void __thiscall
pbrt::SurfaceInteraction::SetShadingGeometry
          (SurfaceInteraction *this,Normal3f ns,Vector3f dpdus,Vector3f dpdvs,Normal3f dndus,
          Normal3f dndvs,bool orientationIsAuthoritative)

{
  Normal3f *n2;
  Vector3f *this_00;
  Vector3f *this_01;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined7 in_register_00000031;
  float fVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined8 in_XMM2_Qb;
  undefined8 in_XMM4_Qb;
  undefined8 in_XMM6_Qb;
  Normal3<float> NVar9;
  
  auVar6._8_56_ = ns._8_56_;
  auVar6._0_8_ = ns.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  n2 = &(this->super_Interaction).n;
  uVar1 = vmovlps_avx(auVar6._0_16_);
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z = ns.super_Tuple3<pbrt::Normal3,_float>.z;
  if ((int)CONCAT71(in_register_00000031,orientationIsAuthoritative) == 0) {
    NVar9 = FaceForward<float>(&(this->shading).n,n2);
    auVar8._0_8_ = NVar9.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar8._8_56_ = auVar6._8_56_;
    uVar1 = vmovlps_avx(auVar8._0_16_);
    (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
    (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
    (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z =
         NVar9.super_Tuple3<pbrt::Normal3,_float>.z;
  }
  else {
    NVar9 = FaceForward<float>(n2,&(this->shading).n);
    auVar7._0_8_ = NVar9.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar7._8_56_ = auVar6._8_56_;
    uVar1 = vmovlps_avx(auVar7._0_16_);
    (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
    (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y =
         (float)(int)((ulong)uVar1 >> 0x20);
    (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z =
         NVar9.super_Tuple3<pbrt::Normal3,_float>.z;
  }
  auVar2._8_8_ = in_XMM2_Qb;
  auVar2._0_8_ = dpdus.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_8_ = in_XMM4_Qb;
  auVar3._0_8_ = dpdvs.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  this_00 = &(this->shading).dpdu;
  this_01 = &(this->shading).dpdv;
  uVar1 = vmovlps_avx(auVar2);
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z =
       dpdus.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar1 = vmovlps_avx(auVar3);
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  auVar4._8_8_ = in_XMM6_Qb;
  auVar4._0_8_ = dndus.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
       dpdvs.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar1 = vmovlps_avx(auVar4);
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z =
       dndus.super_Tuple3<pbrt::Normal3,_float>.z;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x =
       dndvs.super_Tuple3<pbrt::Normal3,_float>.x;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y =
       dndvs.super_Tuple3<pbrt::Normal3,_float>.y;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z =
       dndvs.super_Tuple3<pbrt::Normal3,_float>.z;
  do {
    fVar5 = LengthSquared<float>(this_00);
    if (fVar5 <= 1e+16) {
      fVar5 = LengthSquared<float>(this_01);
      if (fVar5 <= 1e+16) {
        return;
      }
    }
    Tuple3<pbrt::Vector3,float>::operator/=((Tuple3<pbrt::Vector3,float> *)this_00,1e+08);
    Tuple3<pbrt::Vector3,float>::operator/=((Tuple3<pbrt::Vector3,float> *)this_01,1e+08);
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    void SetShadingGeometry(Normal3f ns, Vector3f dpdus, Vector3f dpdvs, Normal3f dndus,
                            Normal3f dndvs, bool orientationIsAuthoritative) {
        // Compute _shading.n_ for _SurfaceInteraction_
        shading.n = ns;
        DCHECK_NE(shading.n, Normal3f(0, 0, 0));
        if (orientationIsAuthoritative)
            n = FaceForward(n, shading.n);
        else
            shading.n = FaceForward(shading.n, n);

        // Initialize _shading_ partial derivative values
        shading.dpdu = dpdus;
        shading.dpdv = dpdvs;
        shading.dndu = dndus;
        shading.dndv = dndvs;
        while (LengthSquared(shading.dpdu) > 1e16f ||
               LengthSquared(shading.dpdv) > 1e16f) {
            shading.dpdu /= 1e8f;
            shading.dpdv /= 1e8f;
        }
    }